

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O2

void __thiscall iDynTree::BerdyHelper::cacheSensorsOrdering(BerdyHelper *this)

{
  vector<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_> *this_00;
  pointer plVar1;
  char cVar2;
  SensorType type;
  uint sensorIdx;
  undefined8 *puVar3;
  SensorType *pSVar4;
  long lVar5;
  size_t i;
  ulong uVar6;
  LinkIndex idx_2;
  DOFIndex idx;
  long lVar7;
  IndexRange IVar8;
  Iterator it;
  undefined1 local_a8 [8];
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  IndexRange local_80;
  vector<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_> *local_70;
  undefined4 local_68 [8];
  Iterator local_48 [24];
  
  this_00 = &this->m_sensorsOrdering;
  std::vector<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_>::clear(this_00);
  local_70 = this_00;
  std::vector<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_>::reserve(this_00,0);
  iDynTree::Model::sensors();
  iDynTree::SensorsList::allSensorsIterator();
  while( true ) {
    cVar2 = iDynTree::SensorsList::Iterator::isValid();
    if (cVar2 == '\0') break;
    puVar3 = (undefined8 *)iDynTree::SensorsList::Iterator::operator*(local_48);
    type = (**(code **)(*(long *)*puVar3 + 0x18))();
    pSVar4 = (SensorType *)iDynTree::Model::sensors();
    puVar3 = (undefined8 *)iDynTree::SensorsList::Iterator::operator*(local_48);
    local_68[0] = (**(code **)(*(long *)*puVar3 + 0x18))();
    puVar3 = (undefined8 *)iDynTree::SensorsList::Iterator::operator*(local_48);
    (**(code **)(*(long *)*puVar3 + 0x10))(local_a8);
    sensorIdx = iDynTree::SensorsList::getSensorIndex(pSVar4,(string *)local_68);
    IVar8 = getRangeSensorVariable(this,type,sensorIdx);
    std::__cxx11::string::~string((string *)local_a8);
    local_a0._M_p = (pointer)&local_90;
    local_98 = 0;
    local_90._M_local_buf[0] = '\0';
    puVar3 = (undefined8 *)iDynTree::SensorsList::Iterator::operator*(local_48);
    local_a8._0_4_ = (**(code **)(*(long *)*puVar3 + 0x18))();
    puVar3 = (undefined8 *)iDynTree::SensorsList::Iterator::operator*(local_48);
    (**(code **)(*(long *)*puVar3 + 0x10))((string *)local_68);
    std::__cxx11::string::operator=((string *)&local_a0,(string *)local_68);
    std::__cxx11::string::~string((string *)local_68);
    local_80 = IVar8;
    std::vector<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_>::push_back
              (local_70,(value_type *)local_a8);
    std::__cxx11::string::~string((string *)&local_a0);
    iDynTree::SensorsList::Iterator::operator++(local_48);
  }
  if ((this->m_options).includeAllJointAccelerationsAsSensors == true) {
    lVar7 = 0;
    while( true ) {
      lVar5 = iDynTree::Model::getNrOfDOFs();
      if (lVar5 <= lVar7) break;
      IVar8 = getRangeDOFSensorVariable(this,DOF_ACCELERATION_SENSOR,lVar7);
      local_a0._M_p = (pointer)&local_90;
      local_98 = 0;
      local_90._M_local_buf[0] = '\0';
      local_a8._0_4_ = DOF_ACCELERATION_SENSOR;
      iDynTree::Model::getJointName_abi_cxx11_((long)local_68);
      std::__cxx11::string::operator=((string *)&local_a0,(string *)local_68);
      std::__cxx11::string::~string((string *)local_68);
      local_80.size = 1;
      local_80.offset = IVar8.offset;
      std::vector<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_>::push_back
                (local_70,(value_type *)local_a8);
      std::__cxx11::string::~string((string *)&local_a0);
      lVar7 = lVar7 + 1;
    }
  }
  if ((this->m_options).includeAllJointTorquesAsSensors == true) {
    lVar7 = 0;
    while( true ) {
      lVar5 = iDynTree::Model::getNrOfDOFs();
      if (lVar5 <= lVar7) break;
      IVar8 = getRangeDOFSensorVariable(this,DOF_TORQUE_SENSOR,lVar7);
      local_a0._M_p = (pointer)&local_90;
      local_98 = 0;
      local_90._M_local_buf[0] = '\0';
      local_a8._0_4_ = DOF_TORQUE_SENSOR;
      iDynTree::Model::getJointName_abi_cxx11_((long)local_68);
      std::__cxx11::string::operator=((string *)&local_a0,(string *)local_68);
      std::__cxx11::string::~string((string *)local_68);
      local_80.size = 1;
      local_80.offset = IVar8.offset;
      std::vector<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_>::push_back
                (local_70,(value_type *)local_a8);
      std::__cxx11::string::~string((string *)&local_a0);
      lVar7 = lVar7 + 1;
    }
  }
  if ((this->m_options).includeAllNetExternalWrenchesAsSensors == true) {
    lVar7 = 0;
    while( true ) {
      lVar5 = iDynTree::Model::getNrOfLinks();
      if (lVar5 <= lVar7) break;
      iDynTree::Traversal::getBaseLink();
      lVar5 = iDynTree::Link::getIndex();
      if (((lVar7 != lVar5) || ((this->m_options).berdyVariant != ORIGINAL_BERDY_FIXED_BASE)) ||
         ((this->m_options).includeFixedBaseExternalWrench == true)) {
        IVar8 = getRangeLinkSensorVariable(this,NET_EXT_WRENCH_SENSOR,lVar7);
        local_a0._M_p = (pointer)&local_90;
        local_98 = 0;
        local_90._M_local_buf[0] = '\0';
        local_a8._0_4_ = NET_EXT_WRENCH_SENSOR;
        iDynTree::Model::getLinkName_abi_cxx11_((long)local_68);
        std::__cxx11::string::operator=((string *)&local_a0,(string *)local_68);
        std::__cxx11::string::~string((string *)local_68);
        local_80.size = 6;
        local_80.offset = IVar8.offset;
        std::vector<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_>::push_back
                  (local_70,(value_type *)local_a8);
        std::__cxx11::string::~string((string *)&local_a0);
      }
      lVar7 = lVar7 + 1;
    }
  }
  for (uVar6 = 0;
      plVar1 = (this->berdySensorsInfo).wrenchSensors.
               super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
               _M_start,
      uVar6 < (ulong)((long)(this->berdySensorsInfo).wrenchSensors.
                            super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)plVar1 >> 3);
      uVar6 = uVar6 + 1) {
    IVar8 = getRangeJointSensorVariable(this,JOINT_WRENCH_SENSOR,plVar1[uVar6]);
    local_a0._M_p = (pointer)&local_90;
    local_98 = 0;
    local_90._M_local_buf[0] = '\0';
    local_a8._0_4_ = JOINT_WRENCH_SENSOR;
    iDynTree::Model::getJointName_abi_cxx11_((long)local_68);
    std::__cxx11::string::operator=((string *)&local_a0,(string *)local_68);
    std::__cxx11::string::~string((string *)local_68);
    local_80.size = 6;
    local_80.offset = IVar8.offset;
    std::vector<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_>::push_back
              (local_70,(value_type *)local_a8);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  if ((this->m_options).berdyVariant == BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES) {
    IVar8 = getRangeRCMSensorVariable(this,RCM_SENSOR);
    local_a0._M_p = (pointer)&local_90;
    local_98 = 0;
    local_90._M_local_buf[0] = '\0';
    local_a8._0_4_ = RCM_SENSOR;
    std::__cxx11::string::_M_assign((string *)&local_a0);
    local_80.size = 6;
    local_80.offset = IVar8.offset;
    std::vector<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_>::push_back
              (local_70,(value_type *)local_a8);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<iDynTree::BerdySensor*,std::vector<iDynTree::BerdySensor,std::allocator<iDynTree::BerdySensor>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((this->m_sensorsOrdering).
             super__Vector_base<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (this->m_sensorsOrdering).
             super__Vector_base<iDynTree::BerdySensor,_std::allocator<iDynTree::BerdySensor>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void BerdyHelper::cacheSensorsOrdering()
{
    //TODO: reserve space
    unsigned size = 0;
    m_sensorsOrdering.clear();
    m_sensorsOrdering.reserve(size);

    //To be a bit more flexible, rely on getRangeSensorVariable to have the order of
    //the URDF sensors
    //???: Isn't this a loop in some way??
    for (SensorsList::Iterator it = m_model.sensors().allSensorsIterator();
         it.isValid(); ++it)
    {
        IndexRange sensorRange = this->getRangeSensorVariable((*it)->getSensorType(), m_model.sensors().getSensorIndex((*it)->getSensorType(), (*it)->getName()));

        BerdySensor sensor;
        sensor.type = static_cast<BerdySensorTypes>((*it)->getSensorType());
        sensor.id = (*it)->getName();
        sensor.range = sensorRange;
        m_sensorsOrdering.push_back(sensor);
    }


    //For each URDF sensor, get the offset with the function
    //put everything in a sorted list (sort with the offset)
    //the iterate and add the sensors to the vector

    //The remaining sensor order is hardcoded for now
    if (m_options.includeAllJointAccelerationsAsSensors)
    {
        for (DOFIndex idx = 0; idx < static_cast<DOFIndex>(m_model.getNrOfDOFs()); idx++)
        {
            IndexRange sensorRange = this->getRangeDOFSensorVariable(DOF_ACCELERATION_SENSOR,idx);
            BerdySensor jointAcc;
            jointAcc.type = DOF_ACCELERATION_SENSOR;
            jointAcc.id = m_model.getJointName(idx);
            jointAcc.range = sensorRange;
            m_sensorsOrdering.push_back(jointAcc);

        }
    }

    if (m_options.includeAllJointTorquesAsSensors)
    {
        for (DOFIndex idx = 0; idx < static_cast<DOFIndex>(m_model.getNrOfDOFs()); idx++)
        {
            IndexRange sensorRange = this->getRangeDOFSensorVariable(DOF_TORQUE_SENSOR,idx);
            BerdySensor jointSens;
            jointSens.type = DOF_TORQUE_SENSOR;
            jointSens.id = m_model.getJointName(idx);
            jointSens.range = sensorRange;
            m_sensorsOrdering.push_back(jointSens);
        }
    }

    if (m_options.includeAllNetExternalWrenchesAsSensors)
    {
        for (LinkIndex idx = 0; idx < static_cast<DOFIndex>(m_model.getNrOfLinks()); idx++)
        {
            // If this link is the (fixed) base link and the
            // berdy variant is ORIGINAL_BERDY_FIXED_BASE , then
            // the net wrench applied on the base is not part of the dynamical
            // system. Anyhow, we can still write the base wrench as a function
            // of sum of the joint wrenches of all the joints attached to the base (tipically just one)
            if (m_dynamicsTraversal.getBaseLink()->getIndex() == idx &&
                    (m_options.berdyVariant == ORIGINAL_BERDY_FIXED_BASE &&
                     !m_options.includeFixedBaseExternalWrench))
            {
                continue;
            }

            IndexRange sensorRange = this->getRangeLinkSensorVariable(NET_EXT_WRENCH_SENSOR, idx);
            BerdySensor linkSens;
            linkSens.type = NET_EXT_WRENCH_SENSOR;
            linkSens.id = m_model.getLinkName(idx);
            linkSens.range = sensorRange;
            m_sensorsOrdering.push_back(linkSens);

        }
    }

    for (size_t i = 0; i < this->berdySensorsInfo.wrenchSensors.size(); i++)
    {
        IndexRange sensorRange = this->getRangeJointSensorVariable(JOINT_WRENCH_SENSOR,berdySensorsInfo.wrenchSensors[i]);

        BerdySensor jointSens;
        jointSens.type = JOINT_WRENCH_SENSOR;
        jointSens.id = m_model.getJointName(i);
        jointSens.range = sensorRange;
        m_sensorsOrdering.push_back(jointSens);
    }

    if(m_options.berdyVariant==BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES) {

        IndexRange sensorRange = this->getRangeRCMSensorVariable(RCM_SENSOR);

        BerdySensor linkSensor;
        linkSensor.type = RCM_SENSOR;
        linkSensor.id = m_options.baseLink;
        linkSensor.range = sensorRange;

        m_sensorsOrdering.push_back(linkSensor);
    }

    //To avoid any problem, sort m_sensorsOrdering by range.offset
    std::sort(m_sensorsOrdering.begin(), m_sensorsOrdering.end());

}